

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

void __thiscall peg::LiteralString::LiteralString(LiteralString *this,string *s,bool ignore_case)

{
  bool ignore_case_local;
  string *s_local;
  LiteralString *this_local;
  
  Ope::Ope(&this->super_Ope);
  std::enable_shared_from_this<peg::LiteralString>::enable_shared_from_this
            (&this->super_enable_shared_from_this<peg::LiteralString>);
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__LiteralString_00210cd8;
  std::__cxx11::string::string((string *)&this->lit_,(string *)s);
  this->ignore_case_ = ignore_case;
  std::once_flag::once_flag(&this->init_is_word_);
  this->is_word_ = false;
  return;
}

Assistant:

LiteralString(const std::string &s, bool ignore_case)
      : lit_(s), ignore_case_(ignore_case), is_word_(false) {}